

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Nop * __thiscall MixedArena::alloc<wasm::Nop>(MixedArena *this)

{
  Nop *pNVar1;
  
  pNVar1 = (Nop *)allocSpace(this,0x10,8);
  (pNVar1->super_SpecificExpression<(wasm::Expression::Id)22>).super_Expression._id = NopId;
  (pNVar1->super_SpecificExpression<(wasm::Expression::Id)22>).super_Expression.type.id = 0;
  return pNVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }